

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O2

Move * ddSymmSiftingUp(DdManager *table,int y,int xLow)

{
  int y_00;
  uint uVar1;
  DdHalfWord x;
  DdSubtable *pDVar2;
  long lVar3;
  int iVar4;
  DdHalfWord DVar5;
  int iVar6;
  DdHalfWord DVar7;
  int iVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  int local_6c;
  int local_68;
  DdNode *local_50;
  long local_48;
  double local_40;
  long local_38;
  
  local_50 = (DdNode *)0x0;
  y_00 = table->invperm[y];
  uVar13 = y;
  do {
    lVar15 = (long)(int)uVar13;
    uVar1 = table->subtables[lVar15].next;
    bVar16 = uVar13 < uVar1;
    uVar13 = uVar1;
  } while (bVar16);
  local_68 = table->keys - table->isolated;
  lVar11 = (long)xLow;
  local_6c = local_68;
  do {
    lVar3 = lVar11 * 0xe + 0x12;
    do {
      lVar14 = lVar3;
      lVar12 = lVar11;
      if (lVar15 <= lVar12) {
        DVar5 = cuddNextLow(table,y);
        pDVar10 = (DdNode *)0x0;
        goto LAB_0062cb76;
      }
      iVar6 = table->invperm[lVar12 + 1];
      if (iVar6 == y_00) break;
      iVar4 = cuddTestInteract(table,iVar6,y_00);
      lVar11 = lVar12 + 1;
      lVar3 = lVar14 + 0xe;
    } while (iVar4 == 0);
    local_6c = (local_6c + (uint)(table->vars[iVar6]->ref == 1)) -
               *(int *)((long)&table->subtables->nodelist + lVar14 * 4);
    lVar11 = lVar12 + 1;
  } while( true );
LAB_0062cb76:
  if ((int)DVar5 < xLow) {
    return (Move *)pDVar10;
  }
  if (local_68 < local_6c) {
    return (Move *)pDVar10;
  }
  pDVar2 = table->subtables;
  x = pDVar2[(int)DVar5].next;
  iVar6 = cuddSymmCheck(table,DVar5,y);
  lVar15 = (long)y;
  if (iVar6 == 0) {
    local_40 = (double)local_68;
    if ((x == DVar5) && (pDVar2[lVar15].next == y)) {
      local_48 = (long)table->invperm[(int)DVar5];
      iVar6 = cuddSwapInPlace(table,DVar5,y);
      if (iVar6 == 0) goto LAB_0062cdd5;
      local_38 = lVar15 * 0x38;
      iVar4 = cuddTestInteract(table,(int)local_48,y_00);
      if (iVar4 != 0) {
        local_6c = (local_6c - (uint)(table->vars[local_48]->ref == 1)) +
                   *(int *)((long)&table->subtables->keys + local_38);
      }
      pDVar9 = cuddDynamicAllocNode(table);
      if (pDVar9 == (DdNode *)0x0) goto LAB_0062cdd5;
      pDVar9->index = DVar5;
      pDVar9->ref = y;
      *(int *)((long)&pDVar9->next + 4) = iVar6;
      (pDVar9->type).kids.T = pDVar10;
      if (local_40 * table->maxGrowth < (double)iVar6) {
        return (Move *)pDVar9;
      }
      local_50 = pDVar9;
      if (iVar6 < local_68) {
        local_68 = iVar6;
      }
    }
    else {
      iVar6 = ddSymmGroupMove(table,DVar5,y,(Move **)&local_50);
      pDVar9 = local_50;
      pDVar10 = local_50;
      if (iVar6 == 0) {
LAB_0062cdd5:
        while (pDVar10 != (DdNode *)0x0) {
          pDVar9 = (pDVar10->type).kids.T;
          pDVar10->ref = 0;
          pDVar10->next = table->nextFree;
          table->nextFree = pDVar10;
          pDVar10 = pDVar9;
        }
        return (Move *)0x1;
      }
      DVar5 = local_50->ref;
      do {
        iVar4 = table->invperm[(int)DVar5];
        iVar8 = cuddTestInteract(table,iVar4,y_00);
        if (iVar8 != 0) {
          local_6c = (local_6c - (uint)(table->vars[iVar4]->ref == 1)) +
                     table->subtables[(int)DVar5].keys;
        }
        DVar5 = table->subtables[(int)DVar5].next;
      } while (DVar5 != pDVar9->ref);
      if (local_40 * table->maxGrowth < (double)iVar6) {
        return (Move *)pDVar9;
      }
      if (iVar6 < local_68) {
        local_68 = iVar6;
      }
    }
  }
  else {
    pDVar2[(int)DVar5].next = y;
    DVar5 = pDVar2[lVar15].next;
    do {
      DVar7 = DVar5;
      DVar5 = pDVar2[(int)DVar7].next;
    } while (pDVar2[(int)DVar7].next != y);
    pDVar2[(int)DVar7].next = x;
    pDVar9 = pDVar10;
  }
  DVar5 = cuddNextLow(table,x);
  pDVar10 = pDVar9;
  y = x;
  goto LAB_0062cb76;
}

Assistant:

static Move *
ddSymmSiftingUp(
  DdManager * table,
  int  y,
  int  xLow)
{
    Move *moves;
    Move *move;
    int  x;
    int  size;
    int  i;
    int  gxtop,gybot;
    int  limitSize;
    int  xindex, yindex;
    int  zindex;
    int  z;
    int  isolated;
    int  L;     /* lower bound on DD size */
#ifdef DD_DEBUG
    int  checkL;
#endif


    moves = NULL;
    yindex = table->invperm[y];

    /* Initialize the lower bound.
    ** The part of the DD below the bottom of y' group will not change.
    ** The part of the DD above y that does not interact with y will not
    ** change. The rest may vanish in the best case, except for
    ** the nodes at level xLow, which will not vanish, regardless.
    */
    limitSize = L = table->keys - table->isolated;
    gybot = y;
    while ((unsigned) gybot < table->subtables[gybot].next)
        gybot = table->subtables[gybot].next;
    for (z = xLow + 1; z <= gybot; z++) {
        zindex = table->invperm[z];
        if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
            isolated = table->vars[zindex]->ref == 1;
            L -= table->subtables[z].keys - isolated;
        }
    }

    x = cuddNextLow(table,y);
    while (x >= xLow && L <= limitSize) {
#ifdef DD_DEBUG
        gybot = y;
        while ((unsigned) gybot < table->subtables[gybot].next)
            gybot = table->subtables[gybot].next;
        checkL = table->keys - table->isolated;
        for (z = xLow + 1; z <= gybot; z++) {
            zindex = table->invperm[z];
            if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkL -= table->subtables[z].keys - isolated;
            }
        }
        assert(L == checkL);
#endif
        gxtop = table->subtables[x].next;
        if (cuddSymmCheck(table,x,y)) {
            /* Symmetry found, attach symm groups */
            table->subtables[x].next = y;
            i = table->subtables[y].next;
            while (table->subtables[i].next != (unsigned) y)
                i = table->subtables[i].next;
            table->subtables[i].next = gxtop;
        } else if (table->subtables[x].next == (unsigned) x &&
                   table->subtables[y].next == (unsigned) y) {
            /* x and y have self symmetry */
            xindex = table->invperm[x];
            size = cuddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtables[x].next == (unsigned) x);
            assert(table->subtables[y].next == (unsigned) y);
#endif
            if (size == 0) goto ddSymmSiftingUpOutOfMem;
            /* Update the lower bound. */
            if (cuddTestInteract(table,xindex,yindex)) {
                isolated = table->vars[xindex]->ref == 1;
                L += table->subtables[y].keys - isolated;
            }
            move = (Move *) cuddDynamicAllocNode(table);
            if (move == NULL) goto ddSymmSiftingUpOutOfMem;
            move->x = x;
            move->y = y;
            move->size = size;
            move->next = moves;
            moves = move;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
        } else { /* Group move */
            size = ddSymmGroupMove(table,x,y,&moves);
            if (size == 0) goto ddSymmSiftingUpOutOfMem;
            /* Update the lower bound. */
            z = moves->y;
            do {
                zindex = table->invperm[z];
                if (cuddTestInteract(table,zindex,yindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    L += table->subtables[z].keys - isolated;
                }
                z = table->subtables[z].next;
            } while (z != (int) moves->y);
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
        }
        y = gxtop;
        x = cuddNextLow(table,y);
    }

    return(moves);

ddSymmSiftingUpOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(MV_OOM);

}